

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall
CConnman::BindListenPort
          (CConnman *this,CService *addrBind,bilingual_str *strError,NetPermissionFlags permissions)

{
  long lVar1;
  string original;
  string original_00;
  string original_01;
  string original_02;
  bool bVar2;
  sa_family_t sVar3;
  int iVar4;
  int *piVar5;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *args;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  undefined1 local_208 [12];
  socklen_t len;
  int nOne;
  NetPermissionFlags permissions_local;
  string local_1f0;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  undefined1 local_170 [64];
  bilingual_str local_130;
  bilingual_str local_f0;
  sockaddr_storage sockaddr;
  
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(in_register_0000000c,permissions);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nOne = 1;
  len = 0x80;
  permissions_local = permissions;
  bVar2 = CService::GetSockAddr(addrBind,(sockaddr *)&sockaddr,&len);
  if (!bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_170 + 0x20),"Bind address family for %s not supported",
               (allocator<char> *)&local_1f0);
    original_01._M_string_length._0_4_ = local_208._8_4_;
    original_01._M_dataplus._M_p = (pointer)local_208._0_8_;
    original_01._M_string_length._4_4_ = len;
    original_01.field_2._M_allocated_capacity._0_4_ = nOne;
    original_01.field_2._M_allocated_capacity._4_4_ = permissions_local;
    original_01.field_2._8_8_ = local_1f0._M_dataplus._M_p;
    Untranslated(&local_130,original_01);
    CService::ToStringAddrPort_abi_cxx11_((string *)local_170,addrBind);
    tinyformat::format<std::__cxx11::string>
              (&local_f0,(tinyformat *)&local_130,(bilingual_str *)local_170,pbVar6);
    bilingual_str::operator=(strError,&local_f0);
    bilingual_str::~bilingual_str(&local_f0);
    std::__cxx11::string::~string((string *)local_170);
    bilingual_str::~bilingual_str(&local_130);
    std::__cxx11::string::~string((string *)(local_170 + 0x20));
    bVar2 = ::LogAcceptCategory(NET,Error);
    if (bVar2) {
      logging_function_02._M_str = "BindListenPort";
      logging_function_02._M_len = 0xe;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_02._M_len = 0x50;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_02,source_file_02,0xbec,NET,Error,"%s\n",&strError->original);
    }
    bVar2 = false;
    goto LAB_00180fa8;
  }
  sVar3 = CService::GetSAFamily(addrBind);
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
  std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::operator()
            ((function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)> *)
             local_208,0xa38640,(uint)sVar3,1);
  if ((long *)local_208._0_8_ == (long *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_190,"Couldn\'t open socket for incoming connections (socket returned error %s)"
               ,(allocator<char> *)&local_1f0);
    original_02._M_string_length._0_4_ = local_208._8_4_;
    original_02._M_dataplus._M_p = (pointer)local_208._0_8_;
    original_02._M_string_length._4_4_ = len;
    original_02.field_2._M_allocated_capacity._0_4_ = nOne;
    original_02.field_2._M_allocated_capacity._4_4_ = permissions_local;
    original_02.field_2._8_8_ = local_1f0._M_dataplus._M_p;
    Untranslated(&local_130,original_02);
    piVar5 = __errno_location();
    NetworkErrorString_abi_cxx11_((string *)local_170,*piVar5);
    tinyformat::format<std::__cxx11::string>
              (&local_f0,(tinyformat *)&local_130,(bilingual_str *)local_170,pbVar6);
    bilingual_str::operator=(strError,&local_f0);
    bilingual_str::~bilingual_str(&local_f0);
    std::__cxx11::string::~string((string *)local_170);
    bilingual_str::~bilingual_str(&local_130);
    std::__cxx11::string::~string(local_190);
    bVar2 = ::LogAcceptCategory(NET,Error);
    iVar4 = 0xbf3;
LAB_00180e84:
    if (bVar2 != false) {
      logging_function_03._M_str = "BindListenPort";
      logging_function_03._M_len = 0xe;
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_03._M_len = 0x50;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_03,source_file_03,iVar4,NET,Error,"%s\n",&strError->original);
    }
LAB_00180f97:
    bVar2 = false;
  }
  else {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nOne;
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
    iVar4 = (**(code **)(*(long *)local_208._0_8_ + 0x50))(local_208._0_8_,1,2);
    if (iVar4 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_1b0,"Error setting SO_REUSEADDR on socket: %s, continuing anyway",
                 (allocator<char> *)&local_1f0);
      original._M_string_length._0_4_ = local_208._8_4_;
      original._M_dataplus._M_p = (pointer)local_208._0_8_;
      original._M_string_length._4_4_ = len;
      original.field_2._M_allocated_capacity._0_4_ = nOne;
      original.field_2._M_allocated_capacity._4_4_ = permissions_local;
      original.field_2._8_8_ = local_1f0._M_dataplus._M_p;
      Untranslated(&local_130,original);
      piVar5 = __errno_location();
      NetworkErrorString_abi_cxx11_((string *)local_170,*piVar5);
      tinyformat::format<std::__cxx11::string>
                (&local_f0,(tinyformat *)&local_130,(bilingual_str *)local_170,pbVar6);
      bilingual_str::operator=(strError,&local_f0);
      bilingual_str::~bilingual_str(&local_f0);
      std::__cxx11::string::~string((string *)local_170);
      bilingual_str::~bilingual_str(&local_130);
      std::__cxx11::string::~string(local_1b0);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xbfb;
      logging_function._M_str = "BindListenPort";
      logging_function._M_len = 0xe;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0xbfb,ALL,Info,"%s\n",&strError->original);
    }
    if ((addrBind->super_CNetAddr).m_net == NET_IPV6) {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nOne;
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
      iVar4 = (**(code **)(*(long *)local_208._0_8_ + 0x50))(local_208._0_8_,0x29,0x1a);
      if (iVar4 == -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1d0,"Error setting IPV6_V6ONLY on socket: %s, continuing anyway",
                   (allocator<char> *)&local_1f0);
        original_00._M_string_length._0_4_ = local_208._8_4_;
        original_00._M_dataplus._M_p = (pointer)local_208._0_8_;
        original_00._M_string_length._4_4_ = len;
        original_00.field_2._M_allocated_capacity._0_4_ = nOne;
        original_00.field_2._M_allocated_capacity._4_4_ = permissions_local;
        original_00.field_2._8_8_ = local_1f0._M_dataplus._M_p;
        Untranslated(&local_130,original_00);
        piVar5 = __errno_location();
        NetworkErrorString_abi_cxx11_((string *)local_170,*piVar5);
        tinyformat::format<std::__cxx11::string>
                  (&local_f0,(tinyformat *)&local_130,(bilingual_str *)local_170,pbVar6);
        bilingual_str::operator=(strError,&local_f0);
        bilingual_str::~bilingual_str(&local_f0);
        std::__cxx11::string::~string((string *)local_170);
        bilingual_str::~bilingual_str(&local_130);
        std::__cxx11::string::~string(local_1d0);
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc04;
        logging_function_00._M_str = "BindListenPort";
        logging_function_00._M_len = 0xe;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file_00._M_len = 0x50;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_00,source_file_00,0xc04,ALL,Info,"%s\n",&strError->original);
      }
    }
    iVar4 = (**(code **)(*(long *)local_208._0_8_ + 0x30))(local_208._0_8_,&sockaddr,len);
    if (iVar4 == -1) {
      piVar5 = __errno_location();
      iVar4 = *piVar5;
      if (iVar4 == 0x62) {
        _(&local_130,(ConstevalStringLiteral)0x69cc34);
        CService::ToStringAddrPort_abi_cxx11_((string *)local_170,addrBind);
        tinyformat::format<std::__cxx11::string,char[13]>
                  (&local_f0,(tinyformat *)&local_130,(bilingual_str *)local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Bitcoin Core",(char (*) [13])args_1);
        bilingual_str::operator=(strError,&local_f0);
        bilingual_str::~bilingual_str(&local_f0);
      }
      else {
        _(&local_130,(ConstevalStringLiteral)0x69cc7b);
        CService::ToStringAddrPort_abi_cxx11_((string *)local_170,addrBind);
        NetworkErrorString_abi_cxx11_(&local_1f0,iVar4);
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_f0,(tinyformat *)&local_130,(bilingual_str *)local_170,&local_1f0,args_1);
        bilingual_str::operator=(strError,&local_f0);
        bilingual_str::~bilingual_str(&local_f0);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
      std::__cxx11::string::~string((string *)local_170);
      bilingual_str::~bilingual_str(&local_130);
      bVar2 = ::LogAcceptCategory(NET,Error);
      if (bVar2) {
        logging_function_04._M_str = "BindListenPort";
        logging_function_04._M_len = 0xe;
        source_file_04._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file_04._M_len = 0x50;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_04,source_file_04,0xc16,NET,Error,"%s\n",&strError->original);
      }
      goto LAB_00180f97;
    }
    CService::ToStringAddrPort_abi_cxx11_(&local_f0.original,addrBind);
    logging_function_01._M_str = "BindListenPort";
    logging_function_01._M_len = 0xe;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file_01._M_len = 0x50;
    args = "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_01,source_file_01,0xc19,ALL,Info,"Bound to %s\n",&local_f0.original)
    ;
    std::__cxx11::string::~string((string *)&local_f0);
    iVar4 = (**(code **)(*(long *)local_208._0_8_ + 0x38))(local_208._0_8_,0x1000);
    if (iVar4 == -1) {
      _(&local_130,(ConstevalStringLiteral)0x69ccc7);
      piVar5 = __errno_location();
      NetworkErrorString_abi_cxx11_((string *)local_170,*piVar5);
      tinyformat::format<std::__cxx11::string>
                (&local_f0,(tinyformat *)&local_130,(bilingual_str *)local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      bilingual_str::operator=(strError,&local_f0);
      bilingual_str::~bilingual_str(&local_f0);
      std::__cxx11::string::~string((string *)local_170);
      bilingual_str::~bilingual_str(&local_130);
      bVar2 = ::LogAcceptCategory(NET,Error);
      iVar4 = 0xc1f;
      goto LAB_00180e84;
    }
    bVar2 = true;
    std::vector<CConnman::ListenSocket,std::allocator<CConnman::ListenSocket>>::
    emplace_back<std::unique_ptr<Sock,std::default_delete<Sock>>,NetPermissionFlags&>
              ((vector<CConnman::ListenSocket,std::allocator<CConnman::ListenSocket>> *)
               &this->vhListenSocket,(unique_ptr<Sock,_std::default_delete<Sock>_> *)local_208,
               &permissions_local);
  }
  if ((long *)local_208._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_208._0_8_ + 8))();
  }
LAB_00180fa8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::BindListenPort(const CService& addrBind, bilingual_str& strError, NetPermissionFlags permissions)
{
    int nOne = 1;

    // Create socket for listening for incoming connections
    struct sockaddr_storage sockaddr;
    socklen_t len = sizeof(sockaddr);
    if (!addrBind.GetSockAddr((struct sockaddr*)&sockaddr, &len))
    {
        strError = strprintf(Untranslated("Bind address family for %s not supported"), addrBind.ToStringAddrPort());
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }

    std::unique_ptr<Sock> sock = CreateSock(addrBind.GetSAFamily(), SOCK_STREAM, IPPROTO_TCP);
    if (!sock) {
        strError = strprintf(Untranslated("Couldn't open socket for incoming connections (socket returned error %s)"), NetworkErrorString(WSAGetLastError()));
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }

    // Allow binding if the port is still in TIME_WAIT state after
    // the program was closed and restarted.
    if (sock->SetSockOpt(SOL_SOCKET, SO_REUSEADDR, (sockopt_arg_type)&nOne, sizeof(int)) == SOCKET_ERROR) {
        strError = strprintf(Untranslated("Error setting SO_REUSEADDR on socket: %s, continuing anyway"), NetworkErrorString(WSAGetLastError()));
        LogPrintf("%s\n", strError.original);
    }

    // some systems don't have IPV6_V6ONLY but are always v6only; others do have the option
    // and enable it by default or not. Try to enable it, if possible.
    if (addrBind.IsIPv6()) {
#ifdef IPV6_V6ONLY
        if (sock->SetSockOpt(IPPROTO_IPV6, IPV6_V6ONLY, (sockopt_arg_type)&nOne, sizeof(int)) == SOCKET_ERROR) {
            strError = strprintf(Untranslated("Error setting IPV6_V6ONLY on socket: %s, continuing anyway"), NetworkErrorString(WSAGetLastError()));
            LogPrintf("%s\n", strError.original);
        }
#endif
#ifdef WIN32
        int nProtLevel = PROTECTION_LEVEL_UNRESTRICTED;
        if (sock->SetSockOpt(IPPROTO_IPV6, IPV6_PROTECTION_LEVEL, (const char*)&nProtLevel, sizeof(int)) == SOCKET_ERROR) {
            strError = strprintf(Untranslated("Error setting IPV6_PROTECTION_LEVEL on socket: %s, continuing anyway"), NetworkErrorString(WSAGetLastError()));
            LogPrintf("%s\n", strError.original);
        }
#endif
    }

    if (sock->Bind(reinterpret_cast<struct sockaddr*>(&sockaddr), len) == SOCKET_ERROR) {
        int nErr = WSAGetLastError();
        if (nErr == WSAEADDRINUSE)
            strError = strprintf(_("Unable to bind to %s on this computer. %s is probably already running."), addrBind.ToStringAddrPort(), PACKAGE_NAME);
        else
            strError = strprintf(_("Unable to bind to %s on this computer (bind returned error %s)"), addrBind.ToStringAddrPort(), NetworkErrorString(nErr));
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }
    LogPrintf("Bound to %s\n", addrBind.ToStringAddrPort());

    // Listen for incoming connections
    if (sock->Listen(SOMAXCONN) == SOCKET_ERROR)
    {
        strError = strprintf(_("Listening for incoming connections failed (listen returned error %s)"), NetworkErrorString(WSAGetLastError()));
        LogPrintLevel(BCLog::NET, BCLog::Level::Error, "%s\n", strError.original);
        return false;
    }

    vhListenSocket.emplace_back(std::move(sock), permissions);
    return true;
}